

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

void __thiscall crnlib::symbol_codec::start_encoding(symbol_codec *this,uint expected_file_size)

{
  this->m_mode = cEncoding;
  this->m_total_model_updates = 0;
  this->m_total_bits_written = 0;
  put_bits_init(this,expected_file_size);
  vector<crnlib::symbol_codec::output_symbol>::resize(&this->m_output_syms,0,false);
  arith_start_encoding(this);
  return;
}

Assistant:

void symbol_codec::start_encoding(uint expected_file_size)
    {
        m_mode = cEncoding;

        m_total_model_updates = 0;
        m_total_bits_written = 0;

        put_bits_init(expected_file_size);

        m_output_syms.resize(0);

        arith_start_encoding();
    }